

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginComboPopup(ImGuiID popup_id,ImRect *bb,ImGuiComboFlags flags)

{
  bool bVar1;
  ImGuiWindow *window;
  float fVar2;
  bool ret;
  ImGuiWindowFlags local_94;
  ImGuiWindowFlags window_flags;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 pos;
  ImRect r_outer;
  ImVec2 size_expected;
  ImGuiWindow *popup_window;
  char name [16];
  ImVec2 local_40;
  ImVec2 local_38;
  int local_30;
  float local_2c;
  int popup_max_height_in_items;
  float w;
  ImGuiContext *g;
  ImRect *pIStack_18;
  ImGuiComboFlags flags_local;
  ImRect *bb_local;
  ImGuiID popup_id_local;
  
  _popup_max_height_in_items = GImGui;
  g._4_4_ = flags;
  pIStack_18 = bb;
  bb_local._0_4_ = popup_id;
  bVar1 = IsPopupOpen(popup_id,0);
  if (bVar1) {
    local_2c = ImRect::GetWidth(pIStack_18);
    if (((_popup_max_height_in_items->NextWindowData).Flags & 0x10U) == 0) {
      if ((g._4_4_ & 0x1e) == 0) {
        g._4_4_ = g._4_4_ | 4;
      }
      bVar1 = ImIsPowerOfTwo(g._4_4_ & 0x1e);
      if (!bVar1) {
        __assert_fail("ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                      ,0x669,"bool ImGui::BeginComboPopup(ImGuiID, const ImRect &, ImGuiComboFlags)"
                     );
      }
      local_30 = -1;
      if ((g._4_4_ & 4) == 0) {
        if ((g._4_4_ & 2) == 0) {
          if ((g._4_4_ & 8) != 0) {
            local_30 = 0x14;
          }
        }
        else {
          local_30 = 4;
        }
      }
      else {
        local_30 = 8;
      }
      ImVec2::ImVec2(&local_38,local_2c,0.0);
      fVar2 = CalcMaxPopupHeightFromItemCount(local_30);
      ImVec2::ImVec2(&local_40,3.4028235e+38,fVar2);
      SetNextWindowSizeConstraints(&local_38,&local_40,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    else {
      fVar2 = ImMax<float>((_popup_max_height_in_items->NextWindowData).SizeConstraintRect.Min.x,
                           local_2c);
      (_popup_max_height_in_items->NextWindowData).SizeConstraintRect.Min.x = fVar2;
    }
    ImFormatString((char *)&popup_window,0x10,"##Combo_%02d",
                   (ulong)(uint)(_popup_max_height_in_items->BeginPopupStack).Size);
    window = FindWindowByName((char *)&popup_window);
    if ((window != (ImGuiWindow *)0x0) && ((window->WasActive & 1U) != 0)) {
      r_outer.Max = CalcWindowNextAutoFitSize(window);
      bVar1 = (g._4_4_ & 1) == 0;
      window->AutoPosLastDirection = (uint)bVar1 + (uint)bVar1 * 2;
      _pos = GetPopupAllowedExtentRect(window);
      local_88 = ImRect::GetBL(pIStack_18);
      local_80 = FindBestWindowPosForPopupEx
                           (&local_88,&r_outer.Max,&window->AutoPosLastDirection,(ImRect *)&pos,
                            pIStack_18,ImGuiPopupPositionPolicy_ComboBox);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff70,0.0,0.0);
      SetNextWindowPos(&local_80,0,(ImVec2 *)&stack0xffffffffffffff70);
    }
    local_94 = 0x4000147;
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff64,
                   (_popup_max_height_in_items->Style).FramePadding.x,
                   (_popup_max_height_in_items->Style).WindowPadding.y);
    PushStyleVar(1,(ImVec2 *)&stack0xffffffffffffff64);
    bVar1 = Begin((char *)&popup_window,(bool *)0x0,local_94);
    PopStyleVar(1);
    if (!bVar1) {
      EndPopup();
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                    ,0x68b,"bool ImGui::BeginComboPopup(ImGuiID, const ImRect &, ImGuiComboFlags)");
    }
    bb_local._7_1_ = true;
  }
  else {
    ImGuiNextWindowData::ClearFlags(&_popup_max_height_in_items->NextWindowData);
    bb_local._7_1_ = false;
  }
  return bb_local._7_1_;
}

Assistant:

bool ImGui::BeginComboPopup(ImGuiID popup_id, const ImRect& bb, ImGuiComboFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (!IsPopupOpen(popup_id, ImGuiPopupFlags_None))
    {
        g.NextWindowData.ClearFlags();
        return false;
    }

    // Set popup size
    float w = bb.GetWidth();
    if (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint)
    {
        g.NextWindowData.SizeConstraintRect.Min.x = ImMax(g.NextWindowData.SizeConstraintRect.Min.x, w);
    }
    else
    {
        if ((flags & ImGuiComboFlags_HeightMask_) == 0)
            flags |= ImGuiComboFlags_HeightRegular;
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_)); // Only one
        int popup_max_height_in_items = -1;
        if (flags & ImGuiComboFlags_HeightRegular)     popup_max_height_in_items = 8;
        else if (flags & ImGuiComboFlags_HeightSmall)  popup_max_height_in_items = 4;
        else if (flags & ImGuiComboFlags_HeightLarge)  popup_max_height_in_items = 20;
        SetNextWindowSizeConstraints(ImVec2(w, 0.0f), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));
    }

    // This is essentially a specialized version of BeginPopupEx()
    char name[16];
    ImFormatString(name, IM_ARRAYSIZE(name), "##Combo_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth

    // Set position given a custom constraint (peak into expected window size so we can position it)
    // FIXME: This might be easier to express with an hypothetical SetNextWindowPosConstraints() function?
    // FIXME: This might be moved to Begin() or at least around the same spot where Tooltips and other Popups are calling FindBestWindowPosForPopupEx()?
    if (ImGuiWindow* popup_window = FindWindowByName(name))
        if (popup_window->WasActive)
        {
            // Always override 'AutoPosLastDirection' to not leave a chance for a past value to affect us.
            ImVec2 size_expected = CalcWindowNextAutoFitSize(popup_window);
            popup_window->AutoPosLastDirection = (flags & ImGuiComboFlags_PopupAlignLeft) ? ImGuiDir_Left : ImGuiDir_Down; // Left = "Below, Toward Left", Down = "Below, Toward Right (default)"
            ImRect r_outer = GetPopupAllowedExtentRect(popup_window);
            ImVec2 pos = FindBestWindowPosForPopupEx(bb.GetBL(), size_expected, &popup_window->AutoPosLastDirection, r_outer, bb, ImGuiPopupPositionPolicy_ComboBox);
            SetNextWindowPos(pos);
        }

    // We don't use BeginPopupEx() solely because we have a custom name string, which we could make an argument to BeginPopupEx()
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoMove;
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(g.Style.FramePadding.x, g.Style.WindowPadding.y)); // Horizontally align ourselves with the framed text
    bool ret = Begin(name, NULL, window_flags);
    PopStyleVar();
    if (!ret)
    {
        EndPopup();
        IM_ASSERT(0);   // This should never happen as we tested for IsPopupOpen() above
        return false;
    }
    return true;
}